

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bssplitscb(bStream *s,const_bstring splitStr,_func_int_void_ptr_int_const_bstring *cb,void *parm
              )

{
  uchar uVar1;
  int iVar2;
  bstring r;
  undefined1 local_78 [7];
  uchar c;
  tagbstring t;
  int local_60;
  int ret;
  int p;
  int i;
  bstring buff;
  charField chrs;
  void *parm_local;
  _func_int_void_ptr_int_const_bstring *cb_local;
  const_bstring splitStr_local;
  bStream *s_local;
  
  ret = 0;
  local_60 = 0;
  t.data._4_4_ = 0;
  if ((((cb == (_func_int_void_ptr_int_const_bstring *)0x0) || (s == (bStream *)0x0)) ||
      (s->readFnPtr == (bNread)0x0)) || ((splitStr == (const_bstring)0x0 || (splitStr->slen < 0))))
  {
    s_local._4_4_ = -1;
  }
  else {
    chrs.content._24_8_ = parm;
    r = bfromcstr(anon_var_dwarf_1aaa1 + 0x10);
    if (r == (bstring)0x0) {
      s_local._4_4_ = -1;
    }
    else {
      if (splitStr->slen == 0) {
        do {
          iVar2 = bsreada(r,s,0x100);
        } while (-1 < iVar2);
        t.data._4_4_ = (*cb)((void *)chrs.content._24_8_,0,r);
        if (0 < t.data._4_4_) {
          t.data._4_4_ = 0;
        }
      }
      else {
        buildCharField((charField *)&buff,splitStr);
        for (; (ret < r->slen || (bsreada(r,s,0x100), ret < r->slen)); ret = ret + 1) {
          if (((ulong)chrs.content[(long)((int)(uint)r->data[ret] >> 3) + -8] &
              1L << (r->data[ret] & 7)) != 0) {
            t._0_8_ = r->data + (long)ret + 1;
            register0x00000000 = r->slen - (ret + 1);
            local_78._0_4_ = -1;
            t.data._4_4_ = bsunread(s,(const_bstring)local_78);
            if (t.data._4_4_ < 0) goto LAB_001628ce;
            r->slen = ret;
            uVar1 = r->data[ret];
            r->data[ret] = '\0';
            t.data._4_4_ = (*cb)((void *)chrs.content._24_8_,local_60,r);
            if (t.data._4_4_ < 0) goto LAB_001628ce;
            r->data[ret] = uVar1;
            r->slen = 0;
            local_60 = ret + 1 + local_60;
            ret = -1;
          }
        }
        t.data._4_4_ = (*cb)((void *)chrs.content._24_8_,local_60,r);
        if (0 < t.data._4_4_) {
          t.data._4_4_ = 0;
        }
      }
LAB_001628ce:
      bdestroy(r);
      s_local._4_4_ = t.data._4_4_;
    }
  }
  return s_local._4_4_;
}

Assistant:

int bssplitscb (struct bStream * s, const_bstring splitStr,
	int (* cb) (void * parm, int ofs, const_bstring entry), void * parm) {
	struct charField chrs;
	bstring buff;
	int i = 0, p = 0, ret = 0;

	if (cb == NULL || s == NULL || s->readFnPtr == NULL ||
	    splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;

	if (NULL == (buff = bfromcstr (""))) return BSTR_ERR;

	if (splitStr->slen == 0) {
		while (bsreada (buff, s, BSSSC_BUFF_LEN) >= 0) ;
		if ((ret = cb (parm, 0, buff)) > 0)
			ret = 0;
	} else {
		buildCharField (&chrs, splitStr);
		for (;;) {
			if (i >= buff->slen) {
				bsreada (buff, s, BSSSC_BUFF_LEN);
				if (i >= buff->slen) {
					if (0 < (ret = cb (parm, p, buff))) ret = 0;
					break;
				}
			}
			if (testInCharField (&chrs, buff->data[i])) {
				struct tagbstring t;
				unsigned char c;

				blk2tbstr (t, buff->data + i + 1, buff->slen - (i + 1));
				if ((ret = bsunread (s, &t)) < 0) break;
				buff->slen = i;
				c = buff->data[i];
				buff->data[i] = (unsigned char) '\0';
				if ((ret = cb (parm, p, buff)) < 0) break;
				buff->data[i] = c;
				buff->slen = 0;
				p += i + 1;
				i = -1;
			}
			i++;
		}
	}

	bdestroy (buff);
	return ret;
}